

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *maxviol,
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *sumviol)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pointer pnVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  VarStatus VVar8;
  int iVar9;
  uint *puVar10;
  long lVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_b8;
  uint *local_38;
  
  bVar17 = 0;
  bVar1 = this->_hasBasis;
  if (bVar1 == true) {
    if ((this->_hasSolRational == true) && (this->_hasSolReal == false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sumviol,0.0);
    lVar16 = (long)(this->_realLP->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar16) {
      local_38 = (maxviol->m_backend).data._M_elems + 1;
      lVar15 = lVar16 << 7;
      do {
        VVar8 = basisRowStatus(this,(int)(lVar16 + -1));
        if (this->_currentSettings->_intParamValues[0] == -1) {
          if (((VVar8 & ~FIXED) != ON_UPPER) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8);
            if (iVar9 < 0) {
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar13 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar15);
              pcVar14 = &local_b8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar14->data)._M_elems[0] = *puVar13;
                puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_b8.exp = *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x70);
              local_b8.neg = *(bool *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x74);
              local_b8._120_8_ = *(undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78);
              if (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,&local_b8);
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = maxviol;
              pcVar14 = &local_b8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
                pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_b8.exp = (maxviol->m_backend).exp;
              local_b8.neg = (maxviol->m_backend).neg;
              local_b8.fpclass = (maxviol->m_backend).fpclass;
              local_b8.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              if (((local_b8.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) &&
                 (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8),
                 iVar9 < 0)) {
                puVar10 = (uint *)((long)&(this->_solReal)._dual.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar15);
                uVar2 = *puVar10;
                puVar13 = puVar10 + 1;
                pcVar14 = &local_b8;
                for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pcVar14->data)._M_elems[0] = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
                }
                uVar3 = puVar10[0x1c];
                uVar5 = *(undefined8 *)(puVar10 + 0x1e);
                uVar7 = puVar10[0x1d];
                (maxviol->m_backend).data._M_elems[0] = uVar2;
                pcVar14 = &local_b8;
                puVar13 = local_38;
                for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
                  *puVar13 = (pcVar14->data)._M_elems[0];
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                }
                (maxviol->m_backend).exp = uVar3;
                (maxviol->m_backend).neg = (bool)((uVar2 != 0 || (int)uVar5 != 0) ^ (byte)uVar7);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
          if ((VVar8 - ZERO < 0xfffffffe) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8);
            if (0 < iVar9) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->_solReal)._dual.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar15));
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar15),&maxviol->m_backend
                                    ), 0 < iVar9)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar15);
                pnVar12 = maxviol;
                for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pnVar12->m_backend).data._M_elems[0] = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                  pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
                }
                (maxviol->m_backend).exp =
                     *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x70);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x74);
                uVar5 = *(undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
        }
        else {
          if (((VVar8 & ~FIXED) != ON_UPPER) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8);
            if (0 < iVar9) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->_solReal)._dual.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar15));
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar15),&maxviol->m_backend
                                    ), 0 < iVar9)) {
                pnVar4 = (this->_solReal)._dual.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar13 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar15);
                pnVar12 = maxviol;
                for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pnVar12->m_backend).data._M_elems[0] = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                  pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
                }
                (maxviol->m_backend).exp =
                     *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x70);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x74);
                uVar5 = *(undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
          if ((VVar8 - ZERO < 0xfffffffe) &&
             (pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) {
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8);
            if (iVar9 < 0) {
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar13 = (uint *)((long)&pnVar4[-1].m_backend.data + lVar15);
              pcVar14 = &local_b8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar14->data)._M_elems[0] = *puVar13;
                puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_b8.exp = *(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x70);
              local_b8.neg = *(bool *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x74);
              local_b8._120_8_ = *(undefined8 *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78);
              if (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&sumviol->m_backend,&local_b8);
              pnVar4 = (this->_solReal)._dual.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = maxviol;
              pcVar14 = &local_b8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
                pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar12 + ((ulong)bVar17 * -2 + 1) * 4);
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_b8.exp = (maxviol->m_backend).exp;
              local_b8.neg = (maxviol->m_backend).neg;
              local_b8.fpclass = (maxviol->m_backend).fpclass;
              local_b8.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
                local_b8.neg = (bool)(local_b8.neg ^ 1);
              }
              if (((local_b8.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&pnVar4[-1].m_backend.data + lVar15 + 0x78) != 2)) &&
                 (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     ((long)&pnVar4[-1].m_backend.data + lVar15),&local_b8),
                 iVar9 < 0)) {
                puVar10 = (uint *)((long)&(this->_solReal)._dual.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar15);
                uVar2 = *puVar10;
                puVar13 = puVar10 + 1;
                pcVar14 = &local_b8;
                for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pcVar14->data)._M_elems[0] = *puVar13;
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
                }
                uVar3 = puVar10[0x1c];
                uVar5 = *(undefined8 *)(puVar10 + 0x1e);
                uVar7 = puVar10[0x1d];
                (maxviol->m_backend).data._M_elems[0] = uVar2;
                pcVar14 = &local_b8;
                puVar13 = local_38;
                for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
                  *puVar13 = (pcVar14->data)._M_elems[0];
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
                  puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
                }
                (maxviol->m_backend).exp = uVar3;
                (maxviol->m_backend).neg = (bool)((uVar2 != 0 || (int)uVar5 != 0) ^ (byte)uVar7);
                (maxviol->m_backend).fpclass = (int)uVar5;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar5 >> 0x20);
              }
            }
          }
        }
        bVar6 = 1 < lVar16;
        lVar16 = lVar16 + -1;
        lVar15 = lVar15 + -0x80;
      } while (bVar6);
    }
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}